

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O1

Matrix3d *
RigidBodyDynamics::CalcBodyWorldOrientation
          (Matrix3d *__return_storage_ptr__,Model *model,VectorNd *Q,uint body_id,
          bool update_kinematics)

{
  pointer pFVar1;
  uint uVar2;
  long lVar3;
  SpatialTransform *pSVar4;
  pointer pSVar5;
  SpatialTransform *pSVar6;
  Matrix3d *pMVar7;
  undefined3 in_register_00000081;
  byte bVar8;
  SpatialTransform SStack_88;
  
  bVar8 = 0;
  if (CONCAT31(in_register_00000081,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  uVar2 = body_id - model->fixed_body_discriminator;
  if (body_id < model->fixed_body_discriminator) {
    pSVar5 = (model->X_base).
             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             .
             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
             ._M_impl.super__Vector_impl_data._M_start + body_id;
  }
  else {
    pFVar1 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Math::SpatialTransform::operator*
              (&SStack_88,&pFVar1[uVar2].mParentTransform,
               (model->X_base).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + pFVar1[uVar2].mMovableParent);
    pFVar1 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = &SStack_88;
    pSVar6 = &pFVar1[uVar2].mBaseTransform;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)&pSVar6->E = *(undefined8 *)pSVar4;
      pSVar4 = (SpatialTransform *)((long)pSVar4 + ((ulong)bVar8 * -2 + 1) * 8);
      pSVar6 = (SpatialTransform *)((long)pSVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    *(double *)((long)&pFVar1[uVar2].mBaseTransform.r + 0x10) =
         SStack_88.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[2];
    *(double *)&pFVar1[uVar2].mBaseTransform.r.super_Vector3d =
         SStack_88.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[0];
    *(double *)((long)&pFVar1[uVar2].mBaseTransform.r + 8) =
         SStack_88.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
         m_storage.m_data.array[1];
    pSVar5 = &(model->mFixedBodies).
              super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              .
              super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar2].mBaseTransform;
  }
  pMVar7 = __return_storage_ptr__;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pMVar7->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] = *(double *)&(pSVar5->E).super_Matrix3d;
    pSVar5 = (pointer)((long)pSVar5 + ((ulong)bVar8 * -2 + 1) * 8);
    pMVar7 = (Matrix3d *)((long)pMVar7 + ((ulong)bVar8 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI Matrix3d CalcBodyWorldOrientation(
    Model &model,
    const VectorNd &Q,
    const unsigned int body_id,
    bool update_kinematics) {
  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  if (body_id >= model.fixed_body_discriminator) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    model.mFixedBodies[fbody_id].mBaseTransform = 
      model.mFixedBodies[fbody_id].mParentTransform 
      * model.X_base[model.mFixedBodies[fbody_id].mMovableParent];

    return model.mFixedBodies[fbody_id].mBaseTransform.E;
  }

  return model.X_base[body_id].E;
}